

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O3

void __thiscall onmt::TokensBuilder::safe_append(TokensBuilder *this,CharInfo *character)

{
  int *piVar1;
  
  if ((this->_no_substitution == false) && (substitutes_abi_cxx11_ != DAT_00383610)) {
    piVar1 = substitutes_abi_cxx11_;
    do {
      if (*piVar1 == character->value) {
        character = (CharInfo *)(piVar1 + 2);
        break;
      }
      piVar1 = piVar1 + 10;
    } while (piVar1 != DAT_00383610);
  }
  std::__cxx11::string::append((char *)&this->_current_token,(ulong)character->data);
  this->_current_length = this->_current_length + 1;
  return;
}

Assistant:

void safe_append(const unicode::CharInfo& character)
    {
      if (!_no_substitution)
      {
        for (const auto& pair : substitutes)
        {
          if (pair.first == character.value)
          {
            append(pair.second);
            return;
          }
        }
      }

      append(character);
    }